

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

Color kratos::color::hsv_to_rgb(double h,double s,double v)

{
  runtime_error *this;
  double dVar1;
  double dVar2;
  Color local_7c;
  uchar b;
  uchar g;
  uchar r;
  double local_68;
  double b_;
  double g_;
  double r_;
  double t;
  double q;
  double p;
  double f;
  int h_i;
  double v_local;
  double s_local;
  double h_local;
  
  dVar1 = h * 6.0 - (double)(int)(h * 6.0);
  dVar2 = v * (1.0 - s);
  g_ = v * (1.0 - dVar1 * s);
  dVar1 = v * (1.0 - (1.0 - dVar1) * s);
  local_68 = dVar2;
  b_ = dVar2;
  switch((int)(h * 6.0)) {
  case 0:
    b_ = dVar1;
    g_ = v;
    break;
  case 1:
    b_ = v;
    break;
  case 2:
    local_68 = dVar1;
    b_ = v;
    g_ = dVar2;
    break;
  case 3:
    local_68 = v;
    b_ = g_;
    g_ = dVar2;
    break;
  case 4:
    local_68 = v;
    g_ = dVar1;
    break;
  case 5:
    local_68 = g_;
    g_ = v;
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"HSV H is larger than 1");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_7c.B = (uchar)(int)(local_68 * 255.0);
  local_7c.R = (char)(int)(g_ * 255.0);
  local_7c.G = (char)(int)(b_ * 255.0);
  return local_7c;
}

Assistant:

Color hsv_to_rgb(double h, double s, double v) {
    auto h_i = static_cast<int>(h * 6);
    auto f = h * 6 - h_i;
    auto p = v * (1 - s);
    auto q = v * (1 - f * s);
    auto t = v * (1 - (1 - f) * s);
    double r_, g_, b_;

    switch (h_i) {
        case 0: {
            r_ = v;
            g_ = t;
            b_ = p;
            break;
        }
        case 1: {
            r_ = q;
            g_ = v;
            b_ = p;
            break;
        }
        case 2: {
            r_ = p;
            g_ = v;
            b_ = t;
            break;
        }
        case 3: {
            r_ = p;
            g_ = q;
            b_ = v;
            break;
        }
        case 4: {
            r_ = t;
            g_ = p;
            b_ = v;
            break;
        }
        case 5: {
            r_ = v;
            g_ = p;
            b_ = q;
            break;
        }
        default:
            throw std::runtime_error("HSV H is larger than 1");
    }
    auto r = static_cast<unsigned char>(r_ * 255);
    auto g = static_cast<unsigned char>(g_ * 255);
    auto b = static_cast<unsigned char>(b_ * 255);
    return {r, g, b};
}